

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

int ply_read_chunk(p_ply ply,void *anybuffer,size_t size)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (size != 0) {
    uVar3 = 0;
    do {
      if (ply->buffer_first < ply->buffer_last) {
        *(char *)((long)anybuffer + uVar3) = ply->buffer[ply->buffer_first];
        ply->buffer_first = ply->buffer_first + 1;
        uVar3 = uVar3 + 1;
      }
      else {
        ply->buffer_first = 0;
        if ((FILE *)ply->fp == (FILE *)0x0) {
          iVar1 = gzread(ply->gzfp,ply->buffer,0x2000);
          sVar2 = (size_t)iVar1;
        }
        else {
          sVar2 = fread(ply->buffer,1,0x2000,(FILE *)ply->fp);
        }
        ply->buffer_last = sVar2;
        if (sVar2 == 0) {
          return 0;
        }
      }
    } while (uVar3 < size);
  }
  return 1;
}

Assistant:

static int ply_read_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *)anybuffer;
    size_t i = 0;
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    assert(ply->buffer_first <= ply->buffer_last);
    while (i < size) {
        if (ply->buffer_first < ply->buffer_last) {
            buffer[i] = ply->buffer[ply->buffer_first];
            ply->buffer_first++;
            i++;
        } else {
            ply->buffer_first = 0;
            if (ply->fp)
                ply->buffer_last = fread(ply->buffer, 1, BUFFERSIZE, ply->fp);
            else
                ply->buffer_last = gzread(ply->gzfp, ply->buffer, BUFFERSIZE);
            if (ply->buffer_last <= 0) return 0;
        }
    }
    return 1;
}